

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

void __thiscall lsim::Simulator::pin_set_default(Simulator *this,pin_t pin,Value value)

{
  pointer puVar1;
  pointer pNVar2;
  ulong uVar3;
  ulong uVar4;
  
  puVar1 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_pin_nodes).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= (ulong)pin) {
    __assert_fail("pin < m_pin_nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x46,"void lsim::Simulator::pin_set_default(pin_t, Value)");
  }
  uVar3 = (ulong)puVar1[pin];
  pNVar2 = (this->m_node_metadata).
           super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->m_node_metadata).
                 super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)pNVar2 >> 3) * -0xf0f0f0f0f0f0f0f;
  if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
    pNVar2[uVar3].m_default = value;
    return;
  }
  __assert_fail("node_id < m_node_metadata.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xcb,"void lsim::Simulator::node_set_default(node_t, Value)");
}

Assistant:

void Simulator::pin_set_default(pin_t pin, Value value) {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    node_set_default(node_id, value);
}